

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O0

void __thiscall QPixmap::detach(QPixmap *this)

{
  bool bVar1;
  ClassId CVar2;
  int iVar3;
  QPlatformPixmap *pQVar4;
  QPlatformPixmap *pQVar5;
  EVP_PKEY_CTX *in_RDI;
  long in_FS_OFFSET;
  QRasterPlatformPixmap *rasterData;
  ClassId id;
  QPlatformPixmap *pd;
  QPlatformPixmap *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  EVP_PKEY_CTX local_30 [16];
  QPixmap local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QExplicitlySharedDataPointer<QPlatformPixmap>::operator!
                    ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x32121d);
  if (!bVar1) {
    pQVar4 = handle((QPixmap *)0x321231);
    CVar2 = QPlatformPixmap::classId(pQVar4);
    pQVar5 = pQVar4;
    if (CVar2 == RasterClass) {
      QImage::detach((QImage *)pQVar4);
      in_stack_ffffffffffffffb0 = pQVar4;
    }
    pQVar4 = QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
                       ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x321270);
    if (pQVar4->is_cached != 0) {
      QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
                ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x321283);
      iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x32128f);
      if (iVar3 == 1) {
        QExplicitlySharedDataPointer<QPlatformPixmap>::data
                  ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x3212a1);
        QImagePixmapCleanupHooks::executePlatformPixmapModificationHooks(pQVar5);
      }
    }
    QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
              ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x3212b6);
    iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x3212c2);
    if (iVar3 != 1) {
      QRect::QRect((QRect *)in_stack_ffffffffffffffb0);
      copy(&local_20,in_RDI,local_30);
      operator=((QPixmap *)CONCAT44(CVar2,in_stack_ffffffffffffffb8),
                (QPixmap *)in_stack_ffffffffffffffb0);
      ~QPixmap((QPixmap *)in_stack_ffffffffffffffb0);
    }
    pQVar5 = QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
                       ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x321309);
    pQVar5->detach_no = pQVar5->detach_no + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmap::detach()
{
    if (!data)
        return;

    // QPixmap.data member may be QRuntimePlatformPixmap so use handle() function to get
    // the actual underlying runtime pixmap data.
    QPlatformPixmap *pd = handle();
    QPlatformPixmap::ClassId id = pd->classId();
    if (id == QPlatformPixmap::RasterClass) {
        QRasterPlatformPixmap *rasterData = static_cast<QRasterPlatformPixmap*>(pd);
        rasterData->image.detach();
    }

    if (data->is_cached && data->ref.loadRelaxed() == 1)
        QImagePixmapCleanupHooks::executePlatformPixmapModificationHooks(data.data());

    if (data->ref.loadRelaxed() != 1) {
        *this = copy();
    }
    ++data->detach_no;
}